

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O0

void __thiscall tst_qpromise_operators::equalTo(tst_qpromise_operators *this)

{
  bool bVar1;
  bool local_82;
  bool local_81;
  bool local_80;
  bool local_7f;
  bool local_7e;
  bool local_7d;
  bool local_7c;
  bool local_7b;
  bool local_7a;
  bool local_79 [7];
  bool local_72;
  bool local_71;
  undefined1 local_70 [8];
  QPromise<int> p3;
  QPromise<int> p2;
  int local_3c;
  undefined1 local_38 [8];
  QPromise<int> p1;
  undefined1 local_20 [8];
  QPromise<int> p0;
  tst_qpromise_operators *this_local;
  
  p1.super_QPromiseBase<int>.m_d.d._4_4_ = 0x2a;
  p0.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  QtPromise::QPromise<int>::resolve
            ((QPromise<int> *)local_20,(int *)((long)&p1.super_QPromiseBase<int>.m_d.d + 4));
  local_3c = 0x2a;
  QtPromise::QPromise<int>::resolve((QPromise<int> *)local_38,&local_3c);
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>
            ((QPromise<int> *)&p3.super_QPromiseBase<int>.m_d,(QPromise<int> *)local_38);
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>
            ((QPromise<int> *)local_70,(QPromise<int> *)&p3.super_QPromiseBase<int>.m_d);
  local_71 = QtPromise::QPromiseBase<int>::operator==
                       ((QPromiseBase<int> *)local_20,(QPromiseBase<int> *)local_38);
  local_72 = false;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_71,&local_72,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x99);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_79[0] = QtPromise::QPromiseBase<int>::operator==
                            ((QPromiseBase<int> *)local_20,
                             (QPromiseBase<int> *)&p3.super_QPromiseBase<int>.m_d);
    local_7a = false;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_79,&local_7a,"p0 == p2","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0x9a);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_7b = QtPromise::QPromiseBase<int>::operator==
                           ((QPromiseBase<int> *)local_20,(QPromiseBase<int> *)local_70);
      local_7c = false;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_7b,&local_7c,"p0 == p3","false",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0x9b);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_7d = QtPromise::QPromiseBase<int>::operator==
                             ((QPromiseBase<int> *)local_38,
                              (QPromiseBase<int> *)&p3.super_QPromiseBase<int>.m_d);
        local_7e = true;
        bVar1 = QTest::qCompare<bool,bool>
                          (&local_7d,&local_7e,"p1 == p2","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0x9c);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_7f = QtPromise::QPromiseBase<int>::operator==
                               ((QPromiseBase<int> *)local_38,(QPromiseBase<int> *)local_70);
          local_80 = true;
          bVar1 = QTest::qCompare<bool,bool>
                            (&local_7f,&local_80,"p1 == p3","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0x9d);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_81 = QtPromise::QPromiseBase<int>::operator==
                                 ((QPromiseBase<int> *)&p3.super_QPromiseBase<int>.m_d,
                                  (QPromiseBase<int> *)local_70);
            local_82 = true;
            bVar1 = QTest::qCompare<bool,bool>
                              (&local_81,&local_82,"p2 == p3","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                               ,0x9e);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_79[1] = false;
              local_79[2] = false;
              local_79[3] = false;
              local_79[4] = false;
            }
            else {
              local_79[1] = true;
              local_79[2] = false;
              local_79[3] = false;
              local_79[4] = false;
            }
          }
          else {
            local_79[1] = true;
            local_79[2] = false;
            local_79[3] = false;
            local_79[4] = false;
          }
        }
        else {
          local_79[1] = true;
          local_79[2] = false;
          local_79[3] = false;
          local_79[4] = false;
        }
      }
      else {
        local_79[1] = true;
        local_79[2] = false;
        local_79[3] = false;
        local_79[4] = false;
      }
    }
    else {
      local_79[1] = true;
      local_79[2] = false;
      local_79[3] = false;
      local_79[4] = false;
    }
  }
  else {
    local_79[1] = true;
    local_79[2] = false;
    local_79[3] = false;
    local_79[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_70);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&p3.super_QPromiseBase<int>.m_d);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_38);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  return;
}

Assistant:

void tst_qpromise_operators::equalTo()
{
    auto p0 = QtPromise::QPromise<int>::resolve(42);
    auto p1 = QtPromise::QPromise<int>::resolve(42);
    auto p2 = p1;
    auto p3(p2);

    QCOMPARE(p0 == p1, false);
    QCOMPARE(p0 == p2, false);
    QCOMPARE(p0 == p3, false);
    QCOMPARE(p1 == p2, true);
    QCOMPARE(p1 == p3, true);
    QCOMPARE(p2 == p3, true);
}